

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

void __thiscall QMessageBox::removeButton(QMessageBox *this,QAbstractButton *button)

{
  QMessageBoxPrivate *this_00;
  long in_FS_OFFSET;
  QWindow *local_28;
  anon_class_8_1_54a39814_for__M_pred local_20;
  long local_18;
  
  local_20.t = &local_28;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  local_28 = (QWindow *)button;
  QtPrivate::
  sequential_erase_if<QList<QAbstractButton*>,QtPrivate::sequential_erase<QList<QAbstractButton*>,QAbstractButton*>(QList<QAbstractButton*>&,QAbstractButton*const&)::_lambda(auto:1_const&)_1_>
            (&this_00->customButtonList,&local_20);
  if (this_00->escapeButton == button) {
    this_00->escapeButton = (QAbstractButton *)0x0;
  }
  if (this_00->defaultButton == (QPushButton *)button) {
    this_00->defaultButton = (QPushButton *)0x0;
  }
  QDialogButtonBox::removeButton((QDialogButtonBox *)this_00->buttonBox,button);
  QMessageBoxPrivate::updateSize(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::removeButton(QAbstractButton *button)
{
    Q_D(QMessageBox);
    d->customButtonList.removeAll(button);
    if (d->escapeButton == button)
        d->escapeButton = nullptr;
    if (d->defaultButton == button)
        d->defaultButton = nullptr;
    d->buttonBox->removeButton(button);
    d->updateSize();
}